

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O2

void testEraseAttributeThrowsWithEmptyString(void)

{
  undefined8 local_48;
  Header header;
  
  local_48 = 0;
  Imf_3_4::Header::Header(&header,0x40,0x40,1.0,(Vec2 *)&local_48,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::Header::erase((char *)&header);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x4e,"void testEraseAttributeThrowsWithEmptyString()");
}

Assistant:

void
testEraseAttributeThrowsWithEmptyString ()
{
    Header header;

    try
    {
        header.erase ("");
        assert (false);
    }
    catch (const ArgExc&)
    {
        assert (true);
    }
}